

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O0

void vera::extractVertexData
               (uint32_t v_pos,uint8_t *base,int accesor_componentType,int accesor_type,
               bool accesor_normalized,uint32_t byteStride,float *output,uint8_t max_num_comp)

{
  uint local_50;
  uint local_4c;
  uint32_t i_1;
  uint32_t i;
  float *data;
  float fStack_38;
  uint32_t ncomp;
  float v [4];
  uint32_t byteStride_local;
  bool accesor_normalized_local;
  int accesor_type_local;
  int accesor_componentType_local;
  uint8_t *base_local;
  uint32_t v_pos_local;
  
  v[3]._3_1_ = accesor_normalized;
  v[2] = (float)byteStride;
  _fStack_38 = 0;
  v[0] = 0.0;
  v[1] = 0.0;
  if (accesor_type == 2) {
    data._4_4_ = 2;
  }
  else if (accesor_type == 3) {
    data._4_4_ = 3;
  }
  else if (accesor_type == 4) {
    data._4_4_ = 4;
  }
  else {
    if (accesor_type != 0x41) {
      __assert_fail("!\"invalid type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/io/gltf.cpp"
                    ,0x70,
                    "void vera::extractVertexData(uint32_t, const uint8_t *, int, int, bool, uint32_t, float *, uint8_t)"
                   );
    }
    data._4_4_ = 1;
  }
  if (accesor_componentType == 0x1406) {
    for (local_4c = 0; local_4c < data._4_4_; local_4c = local_4c + 1) {
      (&fStack_38)[local_4c] = *(float *)(base + (ulong)local_4c * 4 + (ulong)(byteStride * v_pos));
    }
    for (local_50 = 0; local_50 < max_num_comp; local_50 = local_50 + 1) {
      output[local_50] = (&fStack_38)[local_50];
    }
    return;
  }
  __assert_fail("!\"Conversion Type from float to -> ??? not implemented yet\"",
                "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/src/io/gltf.cpp"
                ,0x7c,
                "void vera::extractVertexData(uint32_t, const uint8_t *, int, int, bool, uint32_t, float *, uint8_t)"
               );
}

Assistant:

void extractVertexData(uint32_t v_pos, const uint8_t *base, int accesor_componentType, int accesor_type, bool accesor_normalized, uint32_t byteStride, float *output, uint8_t max_num_comp) {
    float v[4] = {0.0f, 0.0f, 0.0f, 0.0f};
    uint32_t ncomp = 1;
    switch (accesor_type) {
        case TINYGLTF_TYPE_SCALAR: ncomp = 1; break;
        case TINYGLTF_TYPE_VEC2:   ncomp = 2; break;
        case TINYGLTF_TYPE_VEC3:   ncomp = 3; break;
        case TINYGLTF_TYPE_VEC4:   ncomp = 4; break;
        default:
            assert(!"invalid type");
    }
    switch (accesor_componentType) {
        case TINYGLTF_COMPONENT_TYPE_FLOAT: {
            const float *data = (float*)(base+byteStride*v_pos);
            for (uint32_t i = 0; (i < ncomp); ++i) {
                v[i] = data[i];
            }
        }
        // TODO SUPPORT OTHER FORMATS
        break;
        default:
            assert(!"Conversion Type from float to -> ??? not implemented yet");
            break;
    }
    for (uint32_t i = 0; i < max_num_comp; ++i) {
        output[i] = v[i];
    }
}